

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoldMine.hpp
# Opt level: O1

void __thiscall GoldMine::~GoldMine(GoldMine *this)

{
  ~GoldMine(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

virtual ~GoldMine() {}